

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

aiNode * __thiscall
Assimp::BlenderImporter::ConvertNode
          (BlenderImporter *this,Scene *in,Object *obj,ConversionData *conv_data,
          aiMatrix4x4 *parentTransform)

{
  pointer ppaVar1;
  pointer ppaVar2;
  uint i;
  const_iterator __position;
  _Base_ptr p_Var3;
  aiNode *paVar4;
  ulong uVar5;
  uint *puVar6;
  float *pfVar7;
  aiMatrix4x4t<float> *paVar8;
  size_type sVar9;
  aiNode **__s;
  Object *extraout_RDX;
  _Head_base<0UL,_aiNode_*,_false> _Var10;
  float (*pafVar11) [4];
  Object *pOVar12;
  _Self __tmp;
  Scene *pSVar13;
  char *pcVar14;
  BlenderImporter *this_00;
  ulong uVar15;
  ConversionData *conv_data_00;
  uint x;
  long lVar16;
  uint y;
  ulong uVar17;
  long lVar18;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  aiMatrix4x4 m;
  aiMatrix4x4t<float> temp;
  deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_> children;
  _Head_base<0UL,_aiNode_*,_false> local_140;
  ConversionData *local_138;
  _Map_pointer local_130;
  Object *local_128;
  BlenderImporter *local_120;
  Scene *local_118;
  aiMatrix4x4 *local_110;
  undefined1 local_108 [64];
  aiMatrix4x4t<float> local_c8;
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  local_80;
  
  local_120 = this;
  local_118 = in;
  local_110 = parentTransform;
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  _Deque_base(&local_80);
  __position._M_node = (conv_data->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_138 = conv_data;
  while ((_Rb_tree_header *)__position._M_node !=
         &(conv_data->objects)._M_t._M_impl.super__Rb_tree_header) {
    local_108._0_8_ = *(undefined8 *)(__position._M_node + 1);
    if (((value_type)local_108._0_8_)->parent == obj) {
      std::deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
      ::push_back((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                   *)&local_80,(value_type *)local_108);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      std::
      _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
      ::erase_abi_cxx11_((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                          *)local_138,__position);
      __position._M_node = p_Var3;
    }
    else {
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    }
  }
  paVar4 = (aiNode *)operator_new(0x478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,(obj->id).name + 2,(allocator<char> *)&local_c8);
  conv_data_00 = local_138;
  aiNode::aiNode(paVar4,(string *)local_108);
  local_140._M_head_impl = paVar4;
  std::__cxx11::string::~string((string *)local_108);
  this_00 = (BlenderImporter *)
            (obj->data).super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 == (BlenderImporter *)0x0) goto switchD_00403cda_caseD_6;
  switch(obj->type) {
  case Type_MESH:
    ppaVar1 = (conv_data_00->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppaVar2 = (conv_data_00->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar13 = (Scene *)0x5b858d;
    CheckActualType((ElemBase *)this_00,"Mesh");
    ConvertMesh(this_00,pSVar13,extraout_RDX,
                (Mesh *)(obj->data).
                        super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,conv_data_00,&conv_data_00->meshes);
    _Var10._M_head_impl = local_140._M_head_impl;
    uVar17 = (long)ppaVar1 - (long)ppaVar2 >> 3;
    uVar15 = (long)(conv_data_00->meshes).arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(conv_data_00->meshes).arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar5 = uVar15 - uVar17;
    if (uVar17 <= uVar15 && uVar5 != 0) {
      (local_140._M_head_impl)->mNumMeshes = (uint)uVar5;
      puVar6 = (uint *)operator_new__((uVar5 & 0xffffffff) << 2);
      (_Var10._M_head_impl)->mMeshes = puVar6;
      for (uVar15 = 0; uVar15 < (_Var10._M_head_impl)->mNumMeshes; uVar15 = uVar15 + 1) {
        (_Var10._M_head_impl)->mMeshes[uVar15] = (int)uVar17 + (int)uVar15;
        _Var10._M_head_impl = local_140._M_head_impl;
      }
    }
    goto switchD_00403cda_caseD_6;
  case Type_CURVE:
    pcVar14 = "Curve";
    break;
  case Type_SURF:
    pcVar14 = "Surface";
    break;
  case Type_FONT:
    pcVar14 = "Font";
    break;
  case Type_MBALL:
    pcVar14 = "MetaBall";
    break;
  default:
    goto switchD_00403cda_caseD_6;
  case Type_LAMP:
    pcVar14 = "Lamp";
    CheckActualType((ElemBase *)this_00,"Lamp");
    local_108._0_8_ =
         ConvertLight(this_00,(Scene *)pcVar14,obj,
                      (Lamp *)(obj->data).
                              super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(ConversionData *)parentTransform);
    std::vector<aiLight_*,_std::allocator<aiLight_*>_>::push_back
              (&(conv_data_00->lights).arr,(value_type *)local_108);
    goto switchD_00403cda_caseD_6;
  case Type_CAMERA:
    pSVar13 = (Scene *)0x5df6d1;
    CheckActualType((ElemBase *)this_00,"Camera");
    local_108._0_8_ =
         ConvertCamera(this_00,pSVar13,obj,
                       (Camera *)
                       (obj->data).
                       super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,(ConversionData *)parentTransform);
    std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::push_back
              (&(conv_data_00->cameras).arr,(value_type *)local_108);
    goto switchD_00403cda_caseD_6;
  case Type_WAVE:
    pcVar14 = "Wave";
    break;
  case Type_LATTICE:
    pcVar14 = "Lattice";
  }
  NotSupportedObjectType(obj,pcVar14);
switchD_00403cda_caseD_6:
  pafVar11 = obj->obmat;
  local_128 = obj;
  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
    for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
      local_130 = (_Map_pointer)CONCAT44(local_130._4_4_,(*pafVar11)[lVar18]);
      pfVar7 = aiMatrix4x4t<float>::operator[]
                         (&(local_140._M_head_impl)->mTransformation,(uint)lVar18);
      pfVar7[lVar16] = local_130._0_4_;
    }
    pafVar11 = pafVar11 + 1;
  }
  local_108._0_8_ = *(undefined8 *)local_110;
  local_108._8_4_ = local_110->a3;
  local_108._12_4_ = local_110->a4;
  local_108._16_4_ = local_110->b1;
  local_108._20_4_ = local_110->b2;
  local_108._24_4_ = local_110->b3;
  local_108._28_4_ = local_110->b4;
  local_108._32_4_ = local_110->c1;
  local_108._36_4_ = local_110->c2;
  local_108._40_4_ = local_110->c3;
  local_108._44_4_ = local_110->c4;
  local_108._48_4_ = local_110->d1;
  local_108._52_4_ = local_110->d2;
  local_108._56_4_ = local_110->d3;
  local_108._60_4_ = local_110->d4;
  paVar8 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_108);
  local_108._0_8_ = *(undefined8 *)paVar8;
  local_108._8_4_ = paVar8->a3;
  local_108._12_4_ = paVar8->a4;
  local_108._16_4_ = paVar8->b1;
  local_108._20_4_ = paVar8->b2;
  local_108._24_4_ = paVar8->b3;
  local_108._28_4_ = paVar8->b4;
  local_108._32_4_ = paVar8->c1;
  local_108._36_4_ = paVar8->c2;
  local_108._40_4_ = paVar8->c3;
  local_108._44_4_ = paVar8->c4;
  local_108._48_4_ = paVar8->d1;
  local_108._52_4_ = paVar8->d2;
  local_108._56_4_ = paVar8->d3;
  local_108._60_4_ = paVar8->d4;
  local_c8._0_8_ = local_108._0_8_;
  local_c8._8_8_ = local_108._8_8_;
  local_c8._16_8_ = local_108._16_8_;
  local_c8._24_8_ = local_108._24_8_;
  local_c8._32_8_ = local_108._32_8_;
  local_c8._40_8_ = local_108._40_8_;
  local_c8._48_8_ = local_108._48_8_;
  local_c8._56_8_ = local_108._56_8_;
  aiMatrix4x4t<float>::operator*=(&local_c8,&(local_140._M_head_impl)->mTransformation);
  pOVar12 = local_128;
  ((local_140._M_head_impl)->mTransformation).d1 = local_c8.d1;
  ((local_140._M_head_impl)->mTransformation).d2 = local_c8.d2;
  ((local_140._M_head_impl)->mTransformation).d3 = local_c8.d3;
  ((local_140._M_head_impl)->mTransformation).d4 = local_c8.d4;
  ((local_140._M_head_impl)->mTransformation).c1 = local_c8.c1;
  ((local_140._M_head_impl)->mTransformation).c2 = local_c8.c2;
  ((local_140._M_head_impl)->mTransformation).c3 = local_c8.c3;
  ((local_140._M_head_impl)->mTransformation).c4 = local_c8.c4;
  ((local_140._M_head_impl)->mTransformation).b1 = local_c8.b1;
  ((local_140._M_head_impl)->mTransformation).b2 = local_c8.b2;
  ((local_140._M_head_impl)->mTransformation).b3 = local_c8.b3;
  ((local_140._M_head_impl)->mTransformation).b4 = local_c8.b4;
  ((local_140._M_head_impl)->mTransformation).a1 = local_c8.a1;
  ((local_140._M_head_impl)->mTransformation).a2 = local_c8.a2;
  ((local_140._M_head_impl)->mTransformation).a3 = local_c8.a3;
  ((local_140._M_head_impl)->mTransformation).a4 = local_c8.a4;
  sVar9 = std::
          deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
          size((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                *)&local_80);
  _Var10._M_head_impl = local_140._M_head_impl;
  if (sVar9 != 0) {
    sVar9 = std::
            deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
            ::size((deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
                    *)&local_80);
    _Var10._M_head_impl = local_140._M_head_impl;
    (local_140._M_head_impl)->mNumChildren = (uint)sVar9;
    uVar15 = (sVar9 & 0xffffffff) << 3;
    __s = (aiNode **)operator_new__(uVar15);
    memset(__s,0,uVar15);
    (_Var10._M_head_impl)->mChildren = __s;
    local_130 = local_80._M_impl.super__Deque_impl_data._M_start._M_node;
    while (pOVar12 = local_128, conv_data_00 = local_138,
          local_80._M_impl.super__Deque_impl_data._M_start._M_cur !=
          local_80._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      pOVar12 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_c8._0_8_ = *(undefined8 *)&(_Var10._M_head_impl)->mTransformation;
      local_c8.a3 = ((_Var10._M_head_impl)->mTransformation).a3;
      local_c8.a4 = ((_Var10._M_head_impl)->mTransformation).a4;
      local_c8.b1 = ((_Var10._M_head_impl)->mTransformation).b1;
      local_c8.b2 = ((_Var10._M_head_impl)->mTransformation).b2;
      local_c8.b3 = ((_Var10._M_head_impl)->mTransformation).b3;
      local_c8.b4 = ((_Var10._M_head_impl)->mTransformation).b4;
      local_c8.c1 = ((_Var10._M_head_impl)->mTransformation).c1;
      local_c8.c2 = ((_Var10._M_head_impl)->mTransformation).c2;
      local_c8.c3 = ((_Var10._M_head_impl)->mTransformation).c3;
      local_c8.c4 = ((_Var10._M_head_impl)->mTransformation).c4;
      local_c8.d1 = ((_Var10._M_head_impl)->mTransformation).d1;
      local_c8.d2 = ((_Var10._M_head_impl)->mTransformation).d2;
      local_c8.d3 = ((_Var10._M_head_impl)->mTransformation).d3;
      local_c8.d4 = ((_Var10._M_head_impl)->mTransformation).d4;
      aiMatrix4x4t<float>::operator*=(&local_c8,local_110);
      paVar4 = ConvertNode(local_120,local_118,pOVar12,local_138,&local_c8);
      *__s = paVar4;
      __s = __s + 1;
      paVar4->mParent = local_140._M_head_impl;
      local_80._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_80._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      _Var10._M_head_impl = local_140._M_head_impl;
      if (local_80._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_80._M_impl.super__Deque_impl_data._M_start._M_last) {
        local_80._M_impl.super__Deque_impl_data._M_start._M_cur = local_130[1];
        local_130 = local_130 + 1;
        local_80._M_impl.super__Deque_impl_data._M_start._M_last =
             local_80._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
      }
    }
  }
  Blender::BlenderModifierShowcase::ApplyModifiers
            (local_120->modifier_cache,_Var10._M_head_impl,conv_data_00,local_118,pOVar12);
  _Var10._M_head_impl = local_140._M_head_impl;
  local_140._M_head_impl = (aiNode *)0x0;
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
            ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&local_140);
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  ~_Deque_base(&local_80);
  return _Var10._M_head_impl;
}

Assistant:

aiNode* BlenderImporter::ConvertNode(const Scene& in, const Object* obj, ConversionData& conv_data, const aiMatrix4x4& parentTransform)
{
    std::deque<const Object*> children;
    for(ObjectSet::iterator it = conv_data.objects.begin(); it != conv_data.objects.end() ;) {
        const Object* object = *it;
        if (object->parent == obj) {
            children.push_back(object);

            conv_data.objects.erase(it++);
            continue;
        }
        ++it;
    }

    std::unique_ptr<aiNode> node(new aiNode(obj->id.name+2)); // skip over the name prefix 'OB'
    if (obj->data) {
        switch (obj->type)
        {
        case Object :: Type_EMPTY:
            break; // do nothing


            // supported object types
        case Object :: Type_MESH: {
            const size_t old = conv_data.meshes->size();

            CheckActualType(obj->data.get(),"Mesh");
            ConvertMesh(in,obj,static_cast<const Mesh*>(obj->data.get()),conv_data,conv_data.meshes);

            if (conv_data.meshes->size() > old) {
                node->mMeshes = new unsigned int[node->mNumMeshes = static_cast<unsigned int>(conv_data.meshes->size()-old)];
                for (unsigned int i = 0; i < node->mNumMeshes; ++i) {
                    node->mMeshes[i] = static_cast<unsigned int>(i + old);
                }
            }}
            break;
        case Object :: Type_LAMP: {
            CheckActualType(obj->data.get(),"Lamp");
            aiLight* mesh = ConvertLight(in,obj,static_cast<const Lamp*>(
                obj->data.get()),conv_data);

            if (mesh) {
                conv_data.lights->push_back(mesh);
            }}
            break;
        case Object :: Type_CAMERA: {
            CheckActualType(obj->data.get(),"Camera");
            aiCamera* mesh = ConvertCamera(in,obj,static_cast<const Camera*>(
                obj->data.get()),conv_data);

            if (mesh) {
                conv_data.cameras->push_back(mesh);
            }}
            break;


            // unsupported object types / log, but do not break
        case Object :: Type_CURVE:
            NotSupportedObjectType(obj,"Curve");
            break;
        case Object :: Type_SURF:
            NotSupportedObjectType(obj,"Surface");
            break;
        case Object :: Type_FONT:
            NotSupportedObjectType(obj,"Font");
            break;
        case Object :: Type_MBALL:
            NotSupportedObjectType(obj,"MetaBall");
            break;
        case Object :: Type_WAVE:
            NotSupportedObjectType(obj,"Wave");
            break;
        case Object :: Type_LATTICE:
            NotSupportedObjectType(obj,"Lattice");
            break;

            // invalid or unknown type
        default:
            break;
        }
    }

    for(unsigned int x = 0; x < 4; ++x) {
        for(unsigned int y = 0; y < 4; ++y) {
            node->mTransformation[y][x] = obj->obmat[x][y];
        }
    }

    aiMatrix4x4 m = parentTransform;
    m = m.Inverse();

    node->mTransformation = m*node->mTransformation;

    if (children.size()) {
        node->mNumChildren = static_cast<unsigned int>(children.size());
        aiNode** nd = node->mChildren = new aiNode*[node->mNumChildren]();
        for (const Object* nobj :children) {
            *nd = ConvertNode(in,nobj,conv_data,node->mTransformation * parentTransform);
            (*nd++)->mParent = node.get();
        }
    }

    // apply modifiers
    modifier_cache->ApplyModifiers(*node,conv_data,in,*obj);

    return node.release();
}